

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm.c
# Opt level: O2

gpu_object * nvrm_get_fifo(gpu_object *obj,uint64_t gpu_addr,int strict)

{
  int iVar1;
  gpu_object *pgVar2;
  gpu_object *dev;
  nvrm_device *pnVar3;
  uint64_t ctx;
  char *__format;
  
  pgVar2 = (gpu_object *)0x0;
  ctx = gpu_addr;
  while( true ) {
    if (obj == (gpu_object *)0x0) {
      return pgVar2;
    }
    iVar1 = is_fifo(obj,ctx);
    if (iVar1 != 0) {
      pgVar2 = obj;
    }
    ctx = gpu_addr;
    iVar1 = is_fifo_and_addr_belongs(obj,gpu_addr);
    if (iVar1 != 0) {
      return obj;
    }
    if (obj->class_ == 0x80) break;
    obj = obj->parent_object;
  }
  pgVar2 = nvrm_find_object_by_func(obj,is_fifo_and_addr_belongs,gpu_addr);
  if (strict != 0 || pgVar2 != (gpu_object *)0x0) {
    return pgVar2;
  }
  pgVar2 = nvrm_find_object_by_func(obj,is_fifo,0);
  dev = nvrm_get_device(obj);
  if (dev == (gpu_object *)0x0) {
    return pgVar2;
  }
  if (dev->class_data == (void *)0x0) {
    return pgVar2;
  }
  pnVar3 = nvrm_dev(dev);
  if (pnVar3->fifos < 2) {
    return pgVar2;
  }
  if ((nvrm_get_fifo_warned & 1) != 0) {
    return pgVar2;
  }
  iVar1 = nvrm_get_chipset(dev);
  if (iVar1 < 0x81 && iVar1 != 0x50) {
    __format = 
    "ERROR: This trace may not be decoded accurately because there are multiple fifo objects and USER buffer detection is not implemented yet%s\n"
    ;
  }
  else {
    __format = 
    "ERROR: This trace may not be decoded accurately because there are multiple fifo objects and ioctl_creates for some of them were not captured with argument data%s\n"
    ;
  }
  fprintf(_stdout,__format,"");
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  nvrm_get_fifo_warned = 1;
  return pgVar2;
}

Assistant:

struct gpu_object *nvrm_get_fifo(struct gpu_object *obj, uint64_t gpu_addr, int strict)
{
	struct gpu_object *last = NULL;
	while (obj)
	{
		if (is_fifo(obj, 0))
			last = obj;
		if (is_fifo_and_addr_belongs(obj, gpu_addr))
			return obj;
		if (obj->class_ == NVRM_DEVICE_0)
		{
			struct gpu_object *fifo = nvrm_find_object_by_func(obj, is_fifo_and_addr_belongs, gpu_addr);
			if (!fifo && !strict) // fallback, for traces without ioctl_create args
			{
				fifo = nvrm_find_object_by_func(obj, is_fifo, 0);

				struct gpu_object *dev = nvrm_get_device(obj);
				int fifos = 0;
				if (dev && dev->class_data)
					fifos = nvrm_dev(dev)->fifos;

				static int warned = 0;
				if (fifos > 1 && !warned)
				{
					int chipset = nvrm_get_chipset(dev);
					if (chipset > 0x80 || chipset == 0x50)
						mmt_error("This trace may not be decoded accurately because there are multiple fifo objects "
								"and ioctl_creates for some of them were not captured with argument data%s\n", "");
					else
						mmt_error("This trace may not be decoded accurately because there are multiple fifo objects "
								"and USER buffer detection is not implemented yet%s\n", "");
					warned = 1;
				}
			}
			return fifo;
		}

		obj = obj->parent_object;
	}

	return last;
}